

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O0

void __thiscall
glslang::TPpContext::TokenizableIncludeFile::TokenizableIncludeFile
          (TokenizableIncludeFile *this,TSourceLoc *startLoc,string *prologue,
          IncludeResult *includedFile,string *epilogue,TPpContext *pp)

{
  char *pcVar1;
  size_t sVar2;
  TPpContext *pp_local;
  string *epilogue_local;
  IncludeResult *includedFile_local;
  string *prologue_local;
  TSourceLoc *startLoc_local;
  TokenizableIncludeFile *this_local;
  
  tInput::tInput(&this->super_tInput,pp);
  (this->super_tInput)._vptr_tInput = (_func_int **)&PTR__TokenizableIncludeFile_013b2c50;
  std::__cxx11::string::string((string *)&this->prologue_,(string *)prologue);
  std::__cxx11::string::string((string *)&this->epilogue_,(string *)epilogue);
  this->includedFile_ = includedFile;
  TInputScanner::TInputScanner(&this->scanner,3,this->strings,this->lengths,(char **)0x0,0,0,true);
  this->prevScanner = (TInputScanner *)0x0;
  tStringInput::tStringInput(&this->stringInput,pp,&this->scanner);
  pcVar1 = (char *)std::__cxx11::string::data();
  this->strings[0] = pcVar1;
  this->strings[1] = this->includedFile_->headerData;
  pcVar1 = (char *)std::__cxx11::string::data();
  this->strings[2] = pcVar1;
  sVar2 = std::__cxx11::string::size();
  this->lengths[0] = sVar2;
  this->lengths[1] = this->includedFile_->headerLength;
  sVar2 = std::__cxx11::string::size();
  this->lengths[2] = sVar2;
  TInputScanner::setLine(&this->scanner,startLoc->line);
  TInputScanner::setString(&this->scanner,startLoc->string);
  pcVar1 = TSourceLoc::getFilenameStr(startLoc);
  TInputScanner::setFile(&this->scanner,pcVar1,0);
  pcVar1 = TSourceLoc::getFilenameStr(startLoc);
  TInputScanner::setFile(&this->scanner,pcVar1,1);
  pcVar1 = TSourceLoc::getFilenameStr(startLoc);
  TInputScanner::setFile(&this->scanner,pcVar1,2);
  return;
}

Assistant:

TokenizableIncludeFile(const TSourceLoc& startLoc,
                          const std::string& prologue,
                          TShader::Includer::IncludeResult* includedFile,
                          const std::string& epilogue,
                          TPpContext* pp)
            : tInput(pp),
              prologue_(prologue),
              epilogue_(epilogue),
              includedFile_(includedFile),
              scanner(3, strings, lengths, nullptr, 0, 0, true),
              prevScanner(nullptr),
              stringInput(pp, scanner)
        {
              strings[0] = prologue_.data();
              strings[1] = includedFile_->headerData;
              strings[2] = epilogue_.data();

              lengths[0] = prologue_.size();
              lengths[1] = includedFile_->headerLength;
              lengths[2] = epilogue_.size();

              scanner.setLine(startLoc.line);
              scanner.setString(startLoc.string);

              scanner.setFile(startLoc.getFilenameStr(), 0);
              scanner.setFile(startLoc.getFilenameStr(), 1);
              scanner.setFile(startLoc.getFilenameStr(), 2);
        }